

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

int template_match(t_template *x1,t_template *x2)

{
  int iVar1;
  uint uVar2;
  t_dataslot *ptVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  t_dataslot *ptVar7;
  
  iVar1 = x1->t_n;
  uVar2 = x2->t_n;
  iVar4 = 0;
  iVar5 = iVar1 - uVar2;
  if ((int)uVar2 <= iVar1) {
    if ((int)uVar2 < iVar1) {
      ptVar7 = x1->t_vec + (int)uVar2;
      do {
        if (ptVar7->ds_type == 3) {
          return 0;
        }
        ptVar7 = ptVar7 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    iVar4 = 1;
    if (0 < (int)uVar2) {
      ptVar7 = x1->t_vec;
      ptVar3 = x2->t_vec;
      lVar6 = 0;
      do {
        if (((*(long *)((long)&ptVar7->ds_name + lVar6) != *(long *)((long)&ptVar3->ds_name + lVar6)
             ) || (iVar1 = *(int *)((long)&ptVar7->ds_type + lVar6),
                  iVar1 != *(int *)((long)&ptVar3->ds_type + lVar6))) ||
           ((iVar1 == 3 &&
            (*(long *)((long)&ptVar7->ds_arraytemplate + lVar6) !=
             *(long *)((long)&ptVar3->ds_arraytemplate + lVar6))))) {
          return 0;
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)uVar2 * 0x18 != lVar6);
    }
  }
  return iVar4;
}

Assistant:

int template_match(t_template *x1, t_template *x2)
{
    int i;
    if (x1->t_n < x2->t_n)
        return (0);
    for (i = x2->t_n; i < x1->t_n; i++)
    {
        if (x1->t_vec[i].ds_type == DT_ARRAY)
                return (0);
    }
    if (x2->t_n > x1->t_n)
        post("add elements...");
    for (i = 0; i < x2->t_n; i++)
        if (!dataslot_matches(&x1->t_vec[i], &x2->t_vec[i], 1))
            return (0);
    return (1);
}